

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
::emplace_decomposable<cs::token_base*,cs::token_base*>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
          *this,token_base **key,size_t hashval,token_base **args)

{
  long lVar1;
  size_t i;
  pair<unsigned_long,_bool> pVar2;
  
  pVar2 = find_or_prepare_insert<cs::token_base*>(this,key,hashval);
  i = pVar2.first;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *(token_base **)(*(long *)(this + 8) + i * 8) = *args;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 8 + lVar1);
  __return_storage_ptr__->second = pVar2.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}